

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O1

optional<QUrl> __thiscall HPack::makePromiseKeyUrl(HPack *this,HttpHeader *requestHeader)

{
  pointer pHVar1;
  longlong lVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  QByteArrayView *pQVar7;
  ulong uVar8;
  storage_type *psVar9;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  pointer pHVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  optional<QUrl> oVar14;
  QUrl url;
  array<std::optional<QByteArrayView>,_4UL> pseudoHeaders;
  QByteArrayView names [4];
  QArrayData *local_118;
  char *pcStack_110;
  undefined8 local_108;
  QUrl local_100;
  QArrayData *local_f8;
  char *pcStack_f0;
  undefined8 local_e8;
  storage_type *local_d8;
  char *pcStack_d0;
  char local_c8 [8];
  longlong lStack_c0;
  char *local_b8;
  undefined8 uStack_b0;
  storage_type *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  storage_type *psStack_90;
  char *local_88;
  ulong uStack_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  char *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = 10;
  local_70 = ":authority";
  local_68 = 7;
  local_60 = ":method";
  local_58 = 5;
  local_50 = ":path";
  local_48 = 7;
  local_40 = ":scheme";
  local_d8 = (storage_type *)0x0;
  pcStack_d0 = (char *)0x0;
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  lStack_c0 = 0;
  local_b8 = (char *)0x0;
  uStack_b0 = 0;
  local_a8 = (storage_type *)0x0;
  pcStack_a0 = (char *)0x0;
  local_98 = 0;
  psStack_90 = (storage_type *)0x0;
  local_88 = (char *)0x0;
  uStack_80 = 0;
  lVar6 = 0x10;
  do {
    *(undefined1 *)((long)&local_d8 + lVar6) = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x70);
  pHVar10 = (requestHeader->
            super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pHVar1 = (requestHeader->
           super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar10 != pHVar1) {
    do {
      pcStack_f0 = (pHVar10->name).d.ptr;
      local_f8 = (QArrayData *)(pHVar10->name).d.size;
      pQVar7 = std::
               __find_if<QByteArrayView_const*,__gnu_cxx::__ops::_Iter_equals_val<QByteArrayView_const>>
                         (&local_78,(QByteArrayView *)&local_38,&local_f8);
      in_RDX = extraout_RDX;
      if (pQVar7 != (QByteArrayView *)&local_38) {
        psVar9 = (storage_type *)(pHVar10->value).d.size;
        if (psVar9 == (storage_type *)0x0) goto LAB_001dd285;
        uVar8 = (long)pQVar7 - (long)&local_78 >> 4;
        if (3 < uVar8) {
          std::__throw_out_of_range_fmt
                    ("array::at: __n (which is %zu) >= _Nm (which is %zu)",uVar8,4);
          goto LAB_001dd4ca;
        }
        if (local_c8[uVar8 * 0x18] == '\x01') goto LAB_001dd285;
        in_RDX = (pHVar10->value).d.ptr;
        (&local_d8)[uVar8 * 3] = psVar9;
        (&pcStack_d0)[uVar8 * 3] = in_RDX;
        local_c8[uVar8 * 0x18] = '\x01';
      }
      pHVar10 = pHVar10 + 1;
    } while (pHVar10 != pHVar1);
  }
  pcVar3 = local_b8;
  lVar2 = lStack_c0;
  if ((((local_c8[0] == '\x01') && ((char)uStack_b0 == '\x01')) && ((char)local_98 == '\x01')) &&
     (((uStack_80 & 1) != 0 &&
      ((iVar5 = qstrnicmp(local_b8,lStack_c0,"get",3), iVar5 == 0 ||
       (iVar5 = qstrnicmp(pcVar3,lVar2,"head",4), in_RDX = extraout_RDX_00, iVar5 == 0)))))) {
    local_100.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(&local_100);
    if ((char)uStack_80 != '\0') {
      psVar9 = (storage_type *)0x0;
      if (0 < (long)psStack_90) {
        psVar9 = psStack_90;
      }
      if (local_88 == (char *)0x0) {
        psVar9 = (storage_type *)0x0;
      }
      if (local_88 != (char *)0x0 && (long)psStack_90 < 0) {
        psVar9 = (storage_type *)strlen(local_88);
      }
      QVar11.m_data = psVar9;
      QVar11.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar11);
      local_118 = local_f8;
      pcStack_110 = pcStack_f0;
      local_108 = local_e8;
      QUrl::setScheme((QString *)&local_100);
      if (local_118 != (QArrayData *)0x0) {
        LOCK();
        (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_118,2,0x10);
        }
      }
      if (local_c8[0] != '\0') {
        psVar9 = (storage_type *)0x0;
        if (0 < (long)local_d8) {
          psVar9 = local_d8;
        }
        if (pcStack_d0 == (char *)0x0) {
          psVar9 = (storage_type *)0x0;
        }
        if (pcStack_d0 != (char *)0x0 && (long)local_d8 < 0) {
          psVar9 = (storage_type *)strlen(pcStack_d0);
        }
        QVar12.m_data = psVar9;
        QVar12.m_size = (qsizetype)&local_f8;
        QString::fromLatin1(QVar12);
        local_118 = local_f8;
        pcStack_110 = pcStack_f0;
        local_108 = local_e8;
        QUrl::setAuthority((QString *)&local_100,(ParsingMode)&local_118);
        if (local_118 != (QArrayData *)0x0) {
          LOCK();
          (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_118,2,0x10);
          }
        }
        if ((char)local_98 != '\0') {
          psVar9 = (storage_type *)0x0;
          if (0 < (long)local_a8) {
            psVar9 = local_a8;
          }
          if (pcStack_a0 == (char *)0x0) {
            psVar9 = (storage_type *)0x0;
          }
          if (pcStack_a0 != (char *)0x0 && (long)local_a8 < 0) {
            psVar9 = (storage_type *)strlen(pcStack_a0);
          }
          QVar13.m_data = psVar9;
          QVar13.m_size = (qsizetype)&local_f8;
          QString::fromLatin1(QVar13);
          local_118 = local_f8;
          pcStack_110 = pcStack_f0;
          local_108 = local_e8;
          QUrl::setPath((QString *)&local_100,(ParsingMode)&local_118);
          if (local_118 != (QArrayData *)0x0) {
            LOCK();
            (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_118,2,0x10);
            }
          }
          cVar4 = QUrl::isValid();
          if (cVar4 != '\0') {
            *(QUrlPrivate **)this = local_100.d;
            local_100.d = (QUrlPrivate *)0x0;
          }
          this[8] = (HPack)(cVar4 != '\0');
          QUrl::~QUrl(&local_100);
          in_RDX = extraout_RDX_01;
          goto LAB_001dd289;
        }
      }
    }
    std::__throw_bad_optional_access();
  }
LAB_001dd285:
  this[8] = (HPack)0x0;
LAB_001dd289:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    oVar14.super__Optional_base<QUrl,_false,_false>._M_payload.
    super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>._8_8_ =
         in_RDX;
    oVar14.super__Optional_base<QUrl,_false,_false>._M_payload.
    super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>._M_payload
         = (_Storage<QUrl,_false>)this;
    return (optional<QUrl>)
           oVar14.super__Optional_base<QUrl,_false,_false>._M_payload.
           super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>;
  }
LAB_001dd4ca:
  __stack_chk_fail();
}

Assistant:

std::optional<QUrl> makePromiseKeyUrl(const HttpHeader &requestHeader)
{
    constexpr QByteArrayView names[] = { ":authority", ":method", ":path", ":scheme" };
    enum PseudoHeaderEnum
    {
        Authority,
        Method,
        Path,
        Scheme
    };
    std::array<std::optional<QByteArrayView>, std::size(names)> pseudoHeaders{};
    for (const auto &field : requestHeader) {
        const auto *it = std::find(std::begin(names), std::end(names), QByteArrayView(field.name));
        if (it != std::end(names)) {
            const auto index = std::distance(std::begin(names), it);
            if (field.value.isEmpty() || pseudoHeaders.at(index).has_value())
                return {};
            pseudoHeaders[index] = field.value;
        }
    }

    auto optionalIsSet = [](const auto &x) { return x.has_value(); };
    if (!std::all_of(pseudoHeaders.begin(), pseudoHeaders.end(), optionalIsSet)) {
        // All four required, HTTP/2 8.1.2.3.
        return {};
    }

    const QByteArrayView method = pseudoHeaders[Method].value();
    if (method.compare("get", Qt::CaseInsensitive) != 0 &&
        method.compare("head", Qt::CaseInsensitive) != 0) {
        return {};
    }

    QUrl url;
    url.setScheme(QLatin1StringView(pseudoHeaders[Scheme].value()));
    url.setAuthority(QLatin1StringView(pseudoHeaders[Authority].value()));
    url.setPath(QLatin1StringView(pseudoHeaders[Path].value()));

    if (!url.isValid())
        return {};
    return url;
}